

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubcommandTest.cpp
# Opt level: O0

void __thiscall TApp_BasicSubcommands_Test::TestBody(TApp_BasicSubcommands_Test *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_03;
  bool bVar1;
  App *pAVar2;
  char *pcVar3;
  reference ppAVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_898;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_820;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_7c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_740;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_6b0;
  AssertionResult gtest_ar_9;
  ExtrasError *e_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_528;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_520;
  string local_500 [32];
  iterator local_4e0;
  size_type local_4d8;
  AssertionResult gtest_ar_8;
  ExtrasError *e;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_430;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  iterator local_408;
  size_type local_400;
  AssertHelper local_3f8;
  Message local_3f0 [2];
  ExtrasError *anon_var_0_1;
  char *pcStack_3d8;
  bool gtest_caught_expected_1;
  ConstCharPtr gtest_msg_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c0;
  iterator local_3a0;
  size_type local_398;
  AssertHelper local_390;
  Message local_388;
  vector<CLI::App_*,_std::allocator<CLI::App_*>_> local_380;
  undefined1 local_368 [8];
  AssertionResult gtest_ar_7;
  Message local_350;
  vector<CLI::App_*,_std::allocator<CLI::App_*>_> local_348;
  size_type local_330;
  unsigned_long local_328;
  undefined1 local_320 [8];
  AssertionResult gtest_ar_6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  iterator local_2e0;
  size_type local_2d8;
  AssertHelper local_2d0;
  Message local_2c8;
  vector<CLI::App_*,_std::allocator<CLI::App_*>_> local_2c0;
  size_type local_2a8;
  unsigned_long local_2a0;
  undefined1 local_298 [8];
  AssertionResult gtest_ar_5;
  Message local_280;
  vector<CLI::App_*,_std::allocator<CLI::App_*>_> local_278;
  undefined1 local_260 [8];
  AssertionResult gtest_ar_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  iterator local_220;
  size_type local_218;
  AssertHelper local_210;
  Message local_208;
  vector<CLI::App_*,_std::allocator<CLI::App_*>_> local_200;
  size_type local_1e8;
  unsigned_long local_1e0;
  undefined1 local_1d8 [8];
  AssertionResult gtest_ar_3;
  Message local_1c0 [2];
  OptionNotFound *anon_var_0;
  string local_1a8;
  byte local_181;
  char *pcStack_180;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  Message local_170;
  allocator local_161;
  string local_160;
  App *local_140;
  undefined1 local_138 [8];
  AssertionResult gtest_ar_2;
  Message local_120;
  App *local_118;
  undefined1 local_110 [8];
  AssertionResult gtest_ar_1;
  Message local_f8;
  App *local_f0;
  App *local_e8;
  undefined1 local_e0 [8];
  AssertionResult gtest_ar;
  string local_c8;
  allocator local_a1;
  string local_a0;
  App *local_80;
  App *sub2;
  string local_70;
  allocator local_39;
  string local_38;
  App *local_18;
  App *sub1;
  TApp_BasicSubcommands_Test *this_local;
  
  sub1 = (App *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"sub1",&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_70,"",(allocator *)((long)&sub2 + 7));
  pAVar2 = CLI::App::add_subcommand(&(this->super_TApp).app,&local_38,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)((long)&sub2 + 7));
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  local_18 = pAVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a0,"sub2",&local_a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_c8,"",(allocator *)((long)&gtest_ar.message_.ptr_ + 7));
  pAVar2 = CLI::App::add_subcommand(&(this->super_TApp).app,&local_a0,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar.message_.ptr_ + 7));
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  local_80 = pAVar2;
  local_e8 = CLI::App::get_parent(local_18);
  local_f0 = &(this->super_TApp).app;
  testing::internal::EqHelper<false>::Compare<CLI::App*,CLI::App*>
            ((EqHelper<false> *)local_e0,"sub1->get_parent()","&app",&local_e8,&local_f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e0);
  if (!bVar1) {
    testing::Message::Message(&local_f8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
               ,0xf,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e0);
  local_118 = CLI::App::get_subcommand(&(this->super_TApp).app,local_18);
  testing::internal::EqHelper<false>::Compare<CLI::App*,CLI::App*>
            ((EqHelper<false> *)local_110,"sub1","app.get_subcommand(sub1)",&local_18,&local_118);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_110);
  if (!bVar1) {
    testing::Message::Message(&local_120);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_110);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
               ,0x11,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_120);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_120);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_110);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_160,"sub1",&local_161);
  local_140 = CLI::App::get_subcommand(&(this->super_TApp).app,&local_160);
  testing::internal::EqHelper<false>::Compare<CLI::App*,CLI::App*>
            ((EqHelper<false> *)local_138,"sub1","app.get_subcommand(\"sub1\")",&local_18,&local_140
            );
  std::__cxx11::string::~string((string *)&local_160);
  std::allocator<char>::~allocator((allocator<char> *)&local_161);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_138);
  if (!bVar1) {
    testing::Message::Message(&local_170);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_138);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_msg,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
               ,0x12,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_msg,&local_170);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_msg);
    testing::Message::~Message(&local_170);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_138);
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffffe80,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffffe80);
  if (bVar1) {
    local_181 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_1a8,"sub3",(allocator *)((long)&anon_var_0 + 7))
      ;
      CLI::App::get_subcommand(&(this->super_TApp).app,&local_1a8);
      std::__cxx11::string::~string((string *)&local_1a8);
      std::allocator<char>::~allocator((allocator<char> *)((long)&anon_var_0 + 7));
    }
    if ((local_181 & 1) == 0) {
      pcStack_180 = 
      "Expected: app.get_subcommand(\"sub3\") throws an exception of type CLI::OptionNotFound.\n  Actual: it throws nothing."
      ;
      goto LAB_00113471;
    }
  }
  else {
LAB_00113471:
    testing::Message::Message(local_1c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
               ,0x13,pcStack_180);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,local_1c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(local_1c0);
  }
  TApp::run(&this->super_TApp);
  local_1e0 = 0;
  CLI::App::get_subcommands(&local_200,&(this->super_TApp).app,true);
  local_1e8 = CLI::std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::size(&local_200);
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_1d8,"(size_t)0","app.get_subcommands().size()",&local_1e0,
             &local_1e8);
  CLI::std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::~vector(&local_200);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d8);
  if (!bVar1) {
    testing::Message::Message(&local_208);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1d8);
    testing::internal::AssertHelper::AssertHelper
              (&local_210,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
               ,0x16,pcVar3);
    testing::internal::AssertHelper::operator=(&local_210,&local_208);
    testing::internal::AssertHelper::~AssertHelper(&local_210);
    testing::Message::~Message(&local_208);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d8);
  CLI::App::reset(&(this->super_TApp).app);
  gtest_ar_4.message_.ptr_._6_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_240,"sub1",(allocator *)((long)&gtest_ar_4.message_.ptr_ + 7));
  gtest_ar_4.message_.ptr_._6_1_ = 0;
  local_220 = &local_240;
  local_218 = 1;
  __l_03._M_len = 1;
  __l_03._M_array = local_220;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->super_TApp).args,__l_03);
  local_6b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_220;
  do {
    local_6b0 = local_6b0 + -1;
    std::__cxx11::string::~string((string *)local_6b0);
  } while (local_6b0 != &local_240);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_4.message_.ptr_ + 7));
  TApp::run(&this->super_TApp);
  CLI::App::get_subcommands(&local_278,&(this->super_TApp).app,true);
  ppAVar4 = CLI::std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::at(&local_278,0);
  testing::internal::EqHelper<false>::Compare<CLI::App*,CLI::App*>
            ((EqHelper<false> *)local_260,"sub1","app.get_subcommands().at(0)",&local_18,ppAVar4);
  CLI::std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::~vector(&local_278);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_260);
  if (!bVar1) {
    testing::Message::Message(&local_280);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_260);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
               ,0x1b,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_280);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_280);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_260);
  pAVar2 = &(this->super_TApp).app;
  CLI::App::reset(pAVar2);
  local_2a0 = 0;
  CLI::App::get_subcommands(&local_2c0,pAVar2,true);
  local_2a8 = CLI::std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::size(&local_2c0);
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_298,"(size_t)0","app.get_subcommands().size()",&local_2a0,
             &local_2a8);
  CLI::std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::~vector(&local_2c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_298);
  if (!bVar1) {
    testing::Message::Message(&local_2c8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_298);
    testing::internal::AssertHelper::AssertHelper
              (&local_2d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
               ,0x1e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_2d0,&local_2c8);
    testing::internal::AssertHelper::~AssertHelper(&local_2d0);
    testing::Message::~Message(&local_2c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_298);
  gtest_ar_6.message_.ptr_._6_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_300,"sub2",(allocator *)((long)&gtest_ar_6.message_.ptr_ + 7));
  gtest_ar_6.message_.ptr_._6_1_ = 0;
  local_2e0 = &local_300;
  local_2d8 = 1;
  __l_02._M_len = 1;
  __l_02._M_array = local_2e0;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->super_TApp).args,__l_02);
  local_740 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2e0;
  do {
    local_740 = local_740 + -1;
    std::__cxx11::string::~string((string *)local_740);
  } while (local_740 != &local_300);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_6.message_.ptr_ + 7));
  TApp::run(&this->super_TApp);
  local_328 = 1;
  CLI::App::get_subcommands(&local_348,&(this->super_TApp).app,true);
  local_330 = CLI::std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::size(&local_348);
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_320,"(size_t)1","app.get_subcommands().size()",&local_328,
             &local_330);
  CLI::std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::~vector(&local_348);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_320);
  if (!bVar1) {
    testing::Message::Message(&local_350);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_320);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
               ,0x22,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_350);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_350);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_320);
  CLI::App::get_subcommands(&local_380,&(this->super_TApp).app,true);
  ppAVar4 = CLI::std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::at(&local_380,0);
  testing::internal::EqHelper<false>::Compare<CLI::App*,CLI::App*>
            ((EqHelper<false> *)local_368,"sub2","app.get_subcommands().at(0)",&local_80,ppAVar4);
  CLI::std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::~vector(&local_380);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_368);
  if (!bVar1) {
    testing::Message::Message(&local_388);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_368);
    testing::internal::AssertHelper::AssertHelper
              (&local_390,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
               ,0x23,pcVar3);
    testing::internal::AssertHelper::operator=(&local_390,&local_388);
    testing::internal::AssertHelper::~AssertHelper(&local_390);
    testing::Message::~Message(&local_388);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_368);
  CLI::App::reset(&(this->super_TApp).app);
  gtest_msg_1.value._6_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_3c0,"SUb2",(allocator *)((long)&gtest_msg_1.value + 7));
  gtest_msg_1.value._6_1_ = 0;
  local_3a0 = &local_3c0;
  local_398 = 1;
  __l_01._M_len = 1;
  __l_01._M_array = local_3a0;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->super_TApp).args,__l_01);
  local_7c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_3a0;
  do {
    local_7c8 = local_7c8 + -1;
    std::__cxx11::string::~string((string *)local_7c8);
  } while (local_7c8 != &local_3c0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_msg_1.value + 7));
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffffc28,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffffc28);
  if (bVar1) {
    anon_var_0_1._7_1_ = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      TApp::run(&this->super_TApp);
    }
    if ((anon_var_0_1._7_1_ & 1) != 0) goto LAB_001143d1;
    pcStack_3d8 = 
    "Expected: run() throws an exception of type CLI::ExtrasError.\n  Actual: it throws nothing.";
  }
  testing::Message::Message(local_3f0);
  testing::internal::AssertHelper::AssertHelper
            (&local_3f8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
             ,0x27,pcStack_3d8);
  testing::internal::AssertHelper::operator=(&local_3f8,local_3f0);
  testing::internal::AssertHelper::~AssertHelper(&local_3f8);
  testing::Message::~Message(local_3f0);
LAB_001143d1:
  CLI::App::reset(&(this->super_TApp).app);
  e._6_1_ = 1;
  local_430 = &local_428;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_428,"SUb2",(allocator *)((long)&e + 7));
  e._6_1_ = 0;
  local_408 = &local_428;
  local_400 = 1;
  __l_00._M_len = 1;
  __l_00._M_array = local_408;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->super_TApp).args,__l_00);
  local_820 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_408;
  do {
    local_820 = local_820 + -1;
    std::__cxx11::string::~string((string *)local_820);
  } while (local_820 != &local_428);
  std::allocator<char>::~allocator((allocator<char> *)((long)&e + 7));
  TApp::run(&this->super_TApp);
  CLI::App::reset(&(this->super_TApp).app);
  e_1._5_1_ = 1;
  local_528 = &local_520;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_520,"sub1",(allocator *)((long)&e_1 + 7));
  local_528 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_500;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_500,"extra",(allocator *)((long)&e_1 + 6));
  e_1._5_1_ = 0;
  local_4e0 = &local_520;
  local_4d8 = 2;
  __l._M_len = 2;
  __l._M_array = local_4e0;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->super_TApp).args,__l);
  local_898 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_4e0;
  do {
    local_898 = local_898 + -1;
    std::__cxx11::string::~string((string *)local_898);
  } while (local_898 != &local_520);
  std::allocator<char>::~allocator((allocator<char> *)((long)&e_1 + 6));
  std::allocator<char>::~allocator((allocator<char> *)((long)&e_1 + 7));
  TApp::run(&this->super_TApp);
  return;
}

Assistant:

TEST_F(TApp, BasicSubcommands) {
    auto sub1 = app.add_subcommand("sub1");
    auto sub2 = app.add_subcommand("sub2");

    EXPECT_EQ(sub1->get_parent(), &app);

    EXPECT_EQ(sub1, app.get_subcommand(sub1));
    EXPECT_EQ(sub1, app.get_subcommand("sub1"));
    EXPECT_THROW(app.get_subcommand("sub3"), CLI::OptionNotFound);

    run();
    EXPECT_EQ((size_t)0, app.get_subcommands().size());

    app.reset();
    args = {"sub1"};
    run();
    EXPECT_EQ(sub1, app.get_subcommands().at(0));

    app.reset();
    EXPECT_EQ((size_t)0, app.get_subcommands().size());

    args = {"sub2"};
    run();
    EXPECT_EQ((size_t)1, app.get_subcommands().size());
    EXPECT_EQ(sub2, app.get_subcommands().at(0));

    app.reset();
    args = {"SUb2"};
    EXPECT_THROW(run(), CLI::ExtrasError);

    app.reset();
    args = {"SUb2"};
    try {
        run();
    } catch(const CLI::ExtrasError &e) {
        EXPECT_THAT(e.what(), HasSubstr("SUb2"));
    }

    app.reset();
    args = {"sub1", "extra"};
    try {
        run();
    } catch(const CLI::ExtrasError &e) {
        EXPECT_THAT(e.what(), HasSubstr("extra"));
    }
}